

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* CLI::detail::get_names
            (tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *input,bool allow_non_standard)

{
  byte bVar1;
  pointer pbVar2;
  pointer pcVar3;
  _Tuple_impl<0ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
  *p_Var4;
  int iVar5;
  BadNameString *pBVar6;
  undefined7 in_register_00000011;
  ulong uVar7;
  pointer pbVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  bool bVar9;
  string name;
  string pos_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  short_names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  long_names;
  value_type local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  undefined4 local_19c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  _Tuple_impl<0ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
  *local_158;
  undefined4 local_150;
  undefined4 uStack_14c;
  undefined1 local_140 [16];
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_19c = (undefined4)CONCAT71(in_register_00000011,allow_non_standard);
  local_198.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  local_1c0._M_string_length = 0;
  local_1c0.field_2._M_local_buf[0] = '\0';
  pbVar8 = (input->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (input->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_158 = (_Tuple_impl<0ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
               *)__return_storage_ptr__;
  if (pbVar8 != pbVar2) {
    do {
      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
      pcVar3 = (pbVar8->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e0,pcVar3,pcVar3 + pbVar8->_M_string_length);
      if (local_1e0._M_string_length != 0) {
        if (((local_1e0._M_string_length == 1) || (*local_1e0._M_dataplus._M_p != 0x2d)) ||
           (local_1e0._M_dataplus._M_p[1] == 0x2d)) {
          if (local_1e0._M_string_length < 3) {
            bVar9 = false;
          }
          else {
            ::std::__cxx11::string::substr((ulong)local_130,(ulong)&local_1e0);
            iVar5 = ::std::__cxx11::string::compare((char *)local_130);
            bVar9 = iVar5 == 0;
            if (local_130[0] != local_120) {
              operator_delete(local_130[0]);
            }
          }
          if (bVar9) {
            ::std::__cxx11::string::substr((ulong)&local_150,(ulong)&local_1e0);
            ::std::__cxx11::string::operator=((string *)&local_1e0,(string *)&local_150);
            if ((undefined1 *)CONCAT44(uStack_14c,local_150) != local_140) {
              operator_delete((undefined1 *)CONCAT44(uStack_14c,local_150));
            }
            if (((local_1e0._M_string_length == 0) || (*local_1e0._M_dataplus._M_p == 0x2d)) ||
               ((byte)*local_1e0._M_dataplus._M_p < 0x22)) {
LAB_001246f7:
              pBVar6 = (BadNameString *)__cxa_allocate_exception(0x38);
              local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_b0,local_1e0._M_dataplus._M_p,
                         local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
              BadNameString::BadLongName(pBVar6,&local_b0);
              __cxa_throw(pBVar6,&BadNameString::typeinfo,Error::~Error);
            }
            uVar7 = 1;
            while (local_1e0._M_string_length != uVar7) {
              bVar1 = local_1e0._M_dataplus._M_p[uVar7];
              if (((bVar1 == 0x3a) || (bVar1 == 0x3d)) ||
                 ((bVar1 == 0x7b || (uVar7 = uVar7 + 1, bVar1 != 9 && bVar1 < 0x21))))
              goto LAB_001246f7;
            }
            this = &local_178;
            goto LAB_00124563;
          }
          iVar5 = ::std::__cxx11::string::compare((char *)&local_1e0);
          if (((iVar5 == 0) ||
              (iVar5 = ::std::__cxx11::string::compare((char *)&local_1e0), iVar5 == 0)) ||
             (iVar5 = ::std::__cxx11::string::compare((char *)&local_1e0), iVar5 == 0)) {
            pBVar6 = (BadNameString *)__cxa_allocate_exception(0x38);
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d0,local_1e0._M_dataplus._M_p,
                       local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
            BadNameString::ReservedName(pBVar6,&local_d0);
            __cxa_throw(pBVar6,&BadNameString::typeinfo,Error::~Error);
          }
          if (local_1c0._M_string_length != 0) {
            pBVar6 = (BadNameString *)__cxa_allocate_exception(0x38);
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_f0,local_1e0._M_dataplus._M_p,
                       local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
            BadNameString::MultiPositionalNames(pBVar6,&local_f0);
            __cxa_throw(pBVar6,&BadNameString::typeinfo,Error::~Error);
          }
          if (((local_1e0._M_string_length == 0) || (*local_1e0._M_dataplus._M_p == 0x2d)) ||
             ((byte)*local_1e0._M_dataplus._M_p < 0x22)) {
LAB_0012475b:
            pBVar6 = (BadNameString *)__cxa_allocate_exception(0x38);
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_110,local_1e0._M_dataplus._M_p,
                       local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
            BadNameString::BadPositionalName(pBVar6,&local_110);
            __cxa_throw(pBVar6,&BadNameString::typeinfo,Error::~Error);
          }
          uVar7 = 1;
          while (local_1e0._M_string_length != uVar7) {
            bVar1 = local_1e0._M_dataplus._M_p[uVar7];
            if (((bVar1 == 0x3a) || (bVar1 == 0x3d)) ||
               ((bVar1 == 0x7b || (uVar7 = uVar7 + 1, bVar1 != 9 && bVar1 < 0x21))))
            goto LAB_0012475b;
          }
          ::std::__cxx11::string::_M_assign((string *)&local_1c0);
        }
        else if ((byte)local_1e0._M_dataplus._M_p[1] < 0x22 || local_1e0._M_string_length != 2) {
          if (local_1e0._M_string_length < 3) {
            pBVar6 = (BadNameString *)__cxa_allocate_exception(0x38);
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_90,local_1e0._M_dataplus._M_p,
                       local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
            BadNameString::OneCharName(pBVar6,&local_90);
            __cxa_throw(pBVar6,&BadNameString::typeinfo,Error::~Error);
          }
          if ((char)local_19c == '\0') {
            pBVar6 = (BadNameString *)__cxa_allocate_exception(0x38);
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,local_1e0._M_dataplus._M_p,
                       local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
            BadNameString::MissingDash(pBVar6,&local_70);
            __cxa_throw(pBVar6,&BadNameString::typeinfo,Error::~Error);
          }
          ::std::__cxx11::string::substr((ulong)&local_150,(ulong)&local_1e0);
          ::std::__cxx11::string::operator=((string *)&local_1e0,(string *)&local_150);
          if ((undefined1 *)CONCAT44(uStack_14c,local_150) != local_140) {
            operator_delete((undefined1 *)CONCAT44(uStack_14c,local_150));
          }
          if (((local_1e0._M_string_length == 0) || (*local_1e0._M_dataplus._M_p == 0x2d)) ||
             ((byte)*local_1e0._M_dataplus._M_p < 0x22)) {
LAB_001247bf:
            pBVar6 = (BadNameString *)__cxa_allocate_exception(0x38);
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_50,local_1e0._M_dataplus._M_p,
                       local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
            BadNameString::BadLongName(pBVar6,&local_50);
            __cxa_throw(pBVar6,&BadNameString::typeinfo,Error::~Error);
          }
          uVar7 = 1;
          while (local_1e0._M_string_length != uVar7) {
            bVar1 = local_1e0._M_dataplus._M_p[uVar7];
            if (((bVar1 == 0x3a) || (bVar1 == 0x3d)) ||
               ((bVar1 == 0x7b || (uVar7 = uVar7 + 1, bVar1 != 9 && bVar1 < 0x21))))
            goto LAB_001247bf;
          }
          this = &local_198;
LAB_00124563:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(this,&local_1e0);
        }
        else {
          local_150 = 1;
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<int,char&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_198
                     ,(int *)&local_150,local_1e0._M_dataplus._M_p + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p);
      }
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != pbVar2);
  }
  p_Var4 = local_158;
  ::std::
  _Tuple_impl<0ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
  ::
  _Tuple_impl<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&,void>
            (local_158,&local_198,&local_178,&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_178);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_198);
  return (tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)p_Var4;
}

Assistant:

CLI11_INLINE std::tuple<std::vector<std::string>, std::vector<std::string>, std::string>
get_names(const std::vector<std::string> &input, bool allow_non_standard) {

    std::vector<std::string> short_names;
    std::vector<std::string> long_names;
    std::string pos_name;
    for(std::string name : input) {
        if(name.length() == 0) {
            continue;
        }
        if(name.length() > 1 && name[0] == '-' && name[1] != '-') {
            if(name.length() == 2 && valid_first_char(name[1])) {
                short_names.emplace_back(1, name[1]);
            } else if(name.length() > 2) {
                if(allow_non_standard) {
                    name = name.substr(1);
                    if(valid_name_string(name)) {
                        short_names.push_back(name);
                    } else {
                        throw BadNameString::BadLongName(name);
                    }
                } else {
                    throw BadNameString::MissingDash(name);
                }
            } else {
                throw BadNameString::OneCharName(name);
            }
        } else if(name.length() > 2 && name.substr(0, 2) == "--") {
            name = name.substr(2);
            if(valid_name_string(name)) {
                long_names.push_back(name);
            } else {
                throw BadNameString::BadLongName(name);
            }
        } else if(name == "-" || name == "--" || name == "++") {
            throw BadNameString::ReservedName(name);
        } else {
            if(!pos_name.empty()) {
                throw BadNameString::MultiPositionalNames(name);
            }
            if(valid_name_string(name)) {
                pos_name = name;
            } else {
                throw BadNameString::BadPositionalName(name);
            }
        }
    }
    return std::make_tuple(short_names, long_names, pos_name);
}